

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O0

void __thiscall YsSoundPlayer::APISpecificData::PrintState(APISpecificData *this,int errCode)

{
  undefined4 uVar1;
  snd_pcm_state_t state;
  int errCode_local;
  APISpecificData *this_local;
  
  if (errCode != 0) {
    if (errCode == 0x4d) {
      printf("EBADFD\n");
    }
    else if (errCode == 0x20) {
      printf("EPIPE\n");
    }
    else if (errCode == 0x56) {
      printf("ESTRPIPE\n");
    }
    else if (errCode == 0xb) {
      printf("EAGAIN\n");
    }
    else {
      printf("Unknown error.\n");
    }
  }
  uVar1 = snd_pcm_state(this->handle);
  switch(uVar1) {
  case 0:
    printf("SND_PCM_STATE_OPEN\n");
    break;
  case 1:
    printf("SND_PCM_STATE_SETUP\n");
    break;
  case 2:
    printf("SND_PCM_STATE_PREPARED\n");
    break;
  case 3:
    printf("SND_PCM_STATE_RUNNING\n");
    break;
  case 4:
    printf("SND_PCM_STATE_XRUN\n");
    break;
  case 5:
    printf("SND_PCM_STATE_DRAINING\n");
    break;
  case 6:
    printf("SND_PCM_STATE_PAUSED\n");
    break;
  case 7:
    printf("SND_PCM_STATE_SUSPENDED\n");
    break;
  case 8:
    printf("SND_PCM_STATE_DISCONNECTED\n");
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PrintState(int errCode)
{
	if(0==errCode)
	{
	}
	else if(EBADFD==errCode)
	{
		printf("EBADFD\n");
	}
	else if(EPIPE==errCode)
	{
		printf("EPIPE\n");
	}
	else if(ESTRPIPE==errCode)
	{
		printf("ESTRPIPE\n");
	}
	else if(EAGAIN==errCode)
	{
		printf("EAGAIN\n");
	}
	else
	{
		printf("Unknown error.\n");
	}

	snd_pcm_state_t state=snd_pcm_state(handle);
	switch(state)
	{
	case SND_PCM_STATE_OPEN:
		printf("SND_PCM_STATE_OPEN\n");
		break;
	case SND_PCM_STATE_SETUP:
		printf("SND_PCM_STATE_SETUP\n");
		break;
	case SND_PCM_STATE_PREPARED:
		printf("SND_PCM_STATE_PREPARED\n");
		break;
	case SND_PCM_STATE_RUNNING:
		printf("SND_PCM_STATE_RUNNING\n");
		break;
	case SND_PCM_STATE_XRUN:
		printf("SND_PCM_STATE_XRUN\n");
		break;
	case SND_PCM_STATE_DRAINING:
		printf("SND_PCM_STATE_DRAINING\n");
		break;
	case SND_PCM_STATE_PAUSED:
		printf("SND_PCM_STATE_PAUSED\n");
		break;
	case SND_PCM_STATE_SUSPENDED:
		printf("SND_PCM_STATE_SUSPENDED\n");
		break;
	case SND_PCM_STATE_DISCONNECTED:
		printf("SND_PCM_STATE_DISCONNECTED\n");
		break;
	}
}